

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.cpp
# Opt level: O3

JoinSide duckdb::JoinSide::GetJoinSide
                   (idx_t table_binding,
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *left_bindings,
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *right_bindings)

{
  const_iterator cVar1;
  idx_t local_8;
  
  local_8 = table_binding;
  cVar1 = ::std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&left_bindings->_M_h,&local_8);
  return (JoinSide)
         ((cVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) +
         LEFT);
}

Assistant:

JoinSide JoinSide::GetJoinSide(idx_t table_binding, const unordered_set<idx_t> &left_bindings,
                               const unordered_set<idx_t> &right_bindings) {
	if (left_bindings.find(table_binding) != left_bindings.end()) {
		// column references table on left side
		D_ASSERT(right_bindings.find(table_binding) == right_bindings.end());
		return JoinSide::LEFT;
	} else {
		// column references table on right side
		D_ASSERT(right_bindings.find(table_binding) != right_bindings.end());
		return JoinSide::RIGHT;
	}
}